

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O1

void TestEncoderVelocity(BasePort *port,AmpIO *board,MotionTrajectory *motion)

{
  undefined8 uVar1;
  pointer ppMVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  int32_t iVar8;
  uint32_t uVar9;
  ostream *poVar10;
  ulong uVar11;
  ofstream *poVar12;
  ulong uVar13;
  pointer ppVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  char *pcVar18;
  EncData *pEVar19;
  undefined8 *puVar20;
  char cVar21;
  pointer pEVar22;
  EncData *pEVar23;
  ulong uVar24;
  bool bVar25;
  byte bVar26;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar27;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar28;
  vector<EncData,_std::allocator<EncData>_> measuredData;
  EncData encData;
  double raccel;
  double rvel;
  double rpos;
  double vel;
  double accel;
  double pos;
  ofstream outFile;
  quadlet_t waveform [1024];
  uint local_131c;
  vector<EncData,_std::allocator<EncData>_> local_1318;
  double local_1300;
  undefined1 local_12f8 [16];
  double local_12e8;
  uint local_12dc;
  ulong local_12d8;
  EncData local_12d0;
  double local_1268;
  double local_1260;
  double local_1258;
  double local_1250;
  double local_1248;
  double local_1240;
  long local_1238;
  filebuf local_1230 [240];
  ios_base local_1140 [264];
  quadlet_t local_1038 [1026];
  
  bVar26 = 0;
  (*(board->super_FpgaIO).super_BoardIO._vptr_BoardIO[10])(board);
  uVar7 = MotionTrajectory::CreateWaveform
                    (motion,local_1038,0x400,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),1,1
                    );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Writing waveform table with ",0x1c);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," entries",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  bVar6 = AmpIO::WriteWaveformTable(board,local_1038,0,(unsigned_short)uVar7);
  if (bVar6) {
    bVar6 = MotionTrajectory::GetValuesAtTime(motion,0.0,&local_1240,&local_1250,&local_1248);
    if (bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Initializing encoders (about 6 seconds)",0x27);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      bVar6 = local_1250 < 0.0;
      AmpIO::WriteDigitalOutput(board,'\x03',!bVar6 * '\x02');
      Amp1394_Sleep(1.4);
      AmpIO::WriteDigitalOutput(board,'\x03',bVar6 * '\x02');
      Amp1394_Sleep(1.4);
      AmpIO::WriteDigitalOutput(board,'\x03',bVar6 * '\x02' + '\x01');
      Amp1394_Sleep(1.4);
      AmpIO::WriteDigitalOutput(board,'\x03',!bVar6 * '\x02' + '\x01');
      Amp1394_Sleep(1.4);
      uVar7 = 0;
      do {
        AmpIO::WriteEncoderPreload(board,uVar7,0);
        uVar7 = uVar7 + 1;
      } while (uVar7 != 4);
      Amp1394_Sleep(0.05);
      (*port->_vptr_BasePort[0x1d])(port);
      uVar7 = 0;
      iVar8 = AmpIO::GetEncoderPosition(board,0);
      bVar6 = iVar8 != 0;
      if (bVar6) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"WriteEncoderPreload: retrying (pos = ",0x25);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          AmpIO::WriteEncoderPreload(board,0,0);
          Amp1394_Sleep(0.05);
          (*port->_vptr_BasePort[0x1d])(port);
          iVar8 = AmpIO::GetEncoderPosition(board,0);
          bVar6 = iVar8 != 0;
          if (iVar8 == 0) break;
          bVar25 = uVar7 < 4;
          uVar7 = uVar7 + 1;
        } while (bVar25);
      }
      if (!bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Starting position = ",0x14);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,", velocity = ",0xd);
        dVar3 = AmpIO::GetEncoderVelocity(board,0);
        poVar10 = std::ostream::_M_insert<double>(dVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,", acceleration = ",0x11);
        dVar3 = AmpIO::GetEncoderAcceleration(board,0,1.0);
        poVar10 = std::ostream::_M_insert<double>(dVar3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Running test",0xc)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
        std::ostream::put(-0x18);
        std::ostream::flush();
        local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
        super__Vector_impl_data._M_start = (EncData *)0x0;
        local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
        super__Vector_impl_data._M_finish = (EncData *)0x0;
        local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (EncData *)0x0;
        ppMVar2 = (motion->motionList).
                  super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppMVar2 ==
            (motion->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar27 = 0;
          uVar28 = 0;
        }
        else {
          dVar3 = ppMVar2[-1]->tf;
          uVar27 = SUB84(dVar3,0);
          uVar28 = (undefined4)((ulong)dVar3 >> 0x20);
        }
        dVar3 = (double)CONCAT44(uVar28,uVar27) / 0.0005;
        uVar11 = (ulong)dVar3;
        std::vector<EncData,_std::allocator<EncData>_>::reserve
                  (&local_1318,(long)(dVar3 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11
                  );
        EncoderVelocity::Init(&local_12d0.encVelData.super_EncoderVelocity);
        local_12d0.mpos = 0;
        AmpIO::WriteWaveformControl(board,'\x03','\x03');
        uVar7 = 1;
        while ((uVar7 != 0 || (local_12d0.mpos == 0))) {
          (*port->_vptr_BasePort[0x1d])(port);
          uVar9 = AmpIO::GetDigitalInput(board);
          if ((uVar9 & 0x20000000) != 0) {
            local_12d0.mpos = AmpIO::GetEncoderPosition(board,0);
            local_12d0.mvel = AmpIO::GetEncoderVelocity(board,0);
            local_12d0.mvelpred = AmpIO::GetEncoderVelocityPredicted(board,0,1.0);
            local_12d0.maccel = AmpIO::GetEncoderAcceleration(board,0,1.0);
            local_12d0.run = AmpIO::GetEncoderRunningCounterSeconds(board,0);
            local_12d0.ts = AmpIO::GetTimestampSeconds(board);
            bVar6 = AmpIO::GetEncoderVelocityData
                              (board,0,&local_12d0.encVelData.super_EncoderVelocity);
            if (!bVar6) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"GetEncoderVelocityData failed",0x1d);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
            }
            if (local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<EncData,std::allocator<EncData>>::_M_realloc_insert<EncData_const&>
                        ((vector<EncData,std::allocator<EncData>> *)&local_1318,
                         (iterator)
                         local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_12d0);
            }
            else {
              pEVar19 = &local_12d0;
              pEVar22 = local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
                uVar27 = *(undefined4 *)&pEVar19->field_0x4;
                pEVar22->mpos = pEVar19->mpos;
                *(undefined4 *)&pEVar22->field_0x4 = uVar27;
                pEVar19 = (EncData *)((long)pEVar19 + (ulong)bVar26 * -0x10 + 8);
                pEVar22 = (EncData *)((long)pEVar22 + (ulong)bVar26 * -0x10 + 8);
              }
              local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar7 = (uVar9 & 0x20000000) >> 0x1d;
          Amp1394_Sleep(0.0005);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read ",5);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," samples",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        ppVar14 = (motion->encList).
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_131c = 0;
        iVar16 = 0;
        if ((motion->encList).
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppVar14) {
          iVar16 = ppVar14->second;
        }
        local_12f8 = ZEXT816(0);
        local_1300 = 0.0;
        if (local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar11 = 1;
          uVar24 = 0;
          local_131c = 0;
          local_1300 = 0.0;
          local_12e8 = 0.0;
          do {
            pEVar19 = local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar24;
            pEVar23 = &local_12d0;
            for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
              uVar27 = *(undefined4 *)&pEVar19->field_0x4;
              pEVar23->mpos = pEVar19->mpos;
              *(undefined4 *)&pEVar23->field_0x4 = uVar27;
              pEVar19 = (EncData *)((long)pEVar19 + (ulong)bVar26 * -0x10 + 8);
              pEVar23 = (EncData *)((long)pEVar23 + ((ulong)bVar26 * -2 + 1) * 8);
            }
            local_12e8 = local_12e8 + local_12d0.ts;
            if (local_12d0.mpos != iVar16) {
              ppVar14 = (motion->encList).
                        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar13 = (long)(motion->encList).
                             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar14 >> 4;
              iVar16 = 0;
              if (uVar11 < uVar13) {
                iVar16 = ppVar14[uVar11].second;
              }
              local_12d8 = uVar24;
              if (local_12d0.mpos == iVar16) {
                uVar27 = 0;
                uVar28 = 0xbff00000;
                if (uVar11 < uVar13) {
                  uVar27 = SUB84(ppVar14[uVar11].first,0);
                  uVar28 = (undefined4)((ulong)ppVar14[uVar11].first >> 0x20);
                }
                uVar11 = uVar11 + 1;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Unexpected encoder position: ",0x1d);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_12d0.mpos)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,", expecting ",0xc);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar16);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," (index = ",10);
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                ppVar14 = (motion->encList).
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar27 = 0;
                uVar28 = 0;
                if ((uVar11 < (ulong)((long)(motion->encList).
                                            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ppVar14 >> 4)) &&
                   (uVar7 = iVar16 - local_12d0.mpos, uVar7 != 0)) {
                  uVar4 = -uVar7;
                  if (0 < (int)uVar7) {
                    uVar4 = uVar7;
                  }
                  lVar17 = uVar11 << 4;
                  uVar24 = uVar11;
                  do {
                    local_12dc = uVar4;
                    iVar5 = local_12d0.mpos;
                    iVar16 = *(int *)((long)&ppVar14->second + lVar17);
                    uVar7 = iVar16 - local_12d0.mpos;
                    uVar4 = -uVar7;
                    if (0 < (int)uVar7) {
                      uVar4 = uVar7;
                    }
                    if (iVar16 == local_12d0.mpos) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Found match at index ",0x15);
                      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      ppVar14 = (motion->encList).
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      uVar27 = 0;
                      uVar28 = 0xbff00000;
                      if (uVar24 < (ulong)((long)(motion->encList).
                                                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)ppVar14 >> 4)) {
                        uVar1 = *(undefined8 *)((long)&ppVar14->first + lVar17);
                        uVar27 = (undefined4)uVar1;
                        uVar28 = (undefined4)((ulong)uVar1 >> 0x20);
                      }
                      uVar11 = uVar24 + 1;
                    }
                    uVar24 = uVar24 + 1;
                    ppVar14 = (motion->encList).
                              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  } while (((uVar24 < (ulong)((long)(motion->encList).
                                                                                                        
                                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)ppVar14 >> 4)) && (iVar16 != iVar5)) &&
                          (lVar17 = lVar17 + 0x10, uVar4 <= local_12dc));
                }
              }
              uVar24 = local_12d8;
              iVar16 = local_12d0.mpos;
              if (((0.0 <= (double)CONCAT44(uVar28,uVar27) && (double)CONCAT44(uVar28,uVar27) != 0.0
                   ) && (local_12d0.encVelData.super_EncoderVelocity.runOverflow == false)) &&
                 (uVar11 < 10)) {
                local_1300 = local_1300 +
                             (local_12e8 - ((double)CONCAT44(uVar28,uVar27) + local_12d0.run));
                local_131c = local_131c + 1;
              }
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 < (ulong)(((long)local_1318.
                                           super__Vector_base<EncData,_std::allocator<EncData>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_1318.
                                           super__Vector_base<EncData,_std::allocator<EncData>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 3) *
                                   0x4ec4ec4ec4ec4ec5));
        }
        if (local_131c != 0) {
          local_12f8._8_8_ = 0;
          local_12f8._0_8_ = local_1300 / (double)local_131c;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Time offset = ",0xe);
        poVar10 = std::ostream::_M_insert<double>((double)local_12f8._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," (",2);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," samples)",9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        std::ofstream::ofstream(&local_1238,"waveform.csv",_S_trunc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1238,
                   "time, mpos, mvel, mvelpred, maccel, run, rpos, rvel, raccel, ts, velper, qtr1, qtr5, flags"
                   ,0x5a);
        std::ios::widen((char)(ostream *)&local_1238 + (char)*(undefined8 *)(local_1238 + -0x18));
        cVar21 = (char)(ofstream *)&local_1238;
        std::ostream::put(cVar21);
        std::ostream::flush();
        if (local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_12f8._0_8_ = local_12f8._0_8_ ^ 0x8000000000000000;
          local_12f8._12_4_ = local_12f8._12_4_ ^ 0x80000000;
          lVar17 = 0;
          uVar11 = 0;
          do {
            puVar20 = (undefined8 *)
                      ((long)&(local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>.
                               _M_impl.super__Vector_impl_data._M_start)->mpos + lVar17);
            pEVar19 = &local_12d0;
            for (lVar15 = 0xd; lVar15 != 0; lVar15 = lVar15 + -1) {
              *(undefined8 *)pEVar19 = *puVar20;
              puVar20 = puVar20 + (ulong)bVar26 * -2 + 1;
              pEVar19 = (EncData *)((long)pEVar19 + ((ulong)bVar26 * -2 + 1) * 8);
            }
            uVar27 = local_12f8._12_4_;
            dVar3 = local_12f8._0_8_ + local_12d0.ts;
            local_12f8._8_4_ = local_12f8._8_4_;
            local_12f8._0_8_ = dVar3;
            local_12f8._12_4_ = uVar27;
            bVar6 = MotionTrajectory::GetValuesAtTime
                              (motion,dVar3,&local_1258,&local_1260,&local_1268);
            if (bVar6) {
              poVar10 = std::ostream::_M_insert<double>((double)local_12f8._0_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,local_12d0.mpos);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::ostream::_M_insert<double>(local_12d0.mvel);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::ostream::_M_insert<double>(local_12d0.mvelpred);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::ostream::_M_insert<double>(local_12d0.maccel);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::ostream::_M_insert<double>(local_12d0.run);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::ostream::_M_insert<double>(local_1258);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::ostream::_M_insert<double>(local_1260);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::ostream::_M_insert<double>(local_1268);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::ostream::_M_insert<double>(local_12d0.ts);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
              EncoderVelocityLocal::PrintFlags(&local_12d0.encVelData,(ofstream *)&local_1238);
              std::ios::widen((char)*(undefined8 *)(local_1238 + -0x18) + cVar21);
              poVar12 = (ofstream *)&local_1238;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"GetValuesAtTime failed for time = ",0x22);
              poVar12 = (ofstream *)std::ostream::_M_insert<double>((double)local_12f8._0_8_);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            }
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            uVar11 = uVar11 + 1;
            lVar17 = lVar17 + 0x68;
          } while (uVar11 < (ulong)(((long)local_1318.
                                           super__Vector_base<EncData,_std::allocator<EncData>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_1318.
                                           super__Vector_base<EncData,_std::allocator<EncData>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 3) *
                                   0x4ec4ec4ec4ec4ec5));
        }
        local_1238 = _VTT;
        *(undefined8 *)(local_1230 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
        std::filebuf::~filebuf(local_1230);
        std::ios_base::~ios_base(local_1140);
        if (local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
            super__Vector_impl_data._M_start == (EncData *)0x0) {
          return;
        }
        operator_delete(local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1318.super__Vector_base<EncData,_std::allocator<EncData>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        return;
      }
      pcVar18 = "Failed to preload encoder";
      lVar17 = 0x19;
    }
    else {
      pcVar18 = "TestEncoderVelocity: failed to get initial values";
      lVar17 = 0x31;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar18,lVar17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"WriteWaveformTable failed",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  }
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void TestEncoderVelocity(BasePort *port, AmpIO *board, MotionTrajectory &motion)
{
    const int WLEN = 1024;
    const int testAxis = 0;   // All axes should be the same when using test board
    quadlet_t waveform[WLEN];
    double dt = board->GetFPGAClockPeriod();

    unsigned int numEntries = motion.CreateWaveform(waveform, WLEN, dt);

    std::cout << "Writing waveform table with " << numEntries << " entries" << std::endl;
    if (!board->WriteWaveformTable(waveform, 0, numEntries)) {
        std::cout << "WriteWaveformTable failed" << std::endl;
        return;
    }

    double pos, vel, accel;
    if (!motion.GetValuesAtTime(0.0, pos, vel, accel)) {
        std::cout << "TestEncoderVelocity: failed to get initial values" << std::endl;
        return;
    }
    std::cout << "Initializing encoders (about 6 seconds)" << std::endl;
    // Initial movements to initialize firmware
    // Wait long enough for encoder period to overflow
    if (vel >= 0) {
        board->WriteDigitalOutput(0x03, 0x02);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x00);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x01);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x03);
        Amp1394_Sleep(1.4);
    }
    else {
        board->WriteDigitalOutput(0x03, 0x00);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x02);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x03);
        Amp1394_Sleep(1.4);
        board->WriteDigitalOutput(0x03, 0x01);
        Amp1394_Sleep(1.4);
    }

    // Initialize encoder position
    unsigned int i;
    for (i = 0; i < 4; i++)
        board->WriteEncoderPreload(i, 0);

    Amp1394_Sleep(0.05);
    port->ReadAllBoards();
    int startPos = board->GetEncoderPosition(testAxis);
    // Sometimes, position is non-zero after preload
    for (i = 0; (i < 5) && (startPos != 0); i++) {
        std::cout << "WriteEncoderPreload: retrying (pos = " << startPos << ")" << std::endl;
        board->WriteEncoderPreload(testAxis, 0);
        Amp1394_Sleep(0.05);
        port->ReadAllBoards();
        startPos = board->GetEncoderPosition(testAxis);
    }
    if (startPos != 0) {
        std::cout << "Failed to preload encoder" << std::endl;
        return;
    }
    std::cout << "Starting position = " << startPos
              << ", velocity = " << board->GetEncoderVelocity(testAxis)
              << ", acceleration = " << board->GetEncoderAcceleration(testAxis) << std::endl;
    std::cout << "Running test" << std::endl;

    std::vector<EncData> measuredData;
    // Estimate data size
    const double loopTime = 0.0005;  // Loop time in seconds (~2 kHz)
    double tf, pf, vf, af;
    motion.GetFinalValues(tf, pf, vf, af);
    // Overestimates datasize because the actual loop time will be less than loopTime.
    size_t dataSize = static_cast<size_t>(tf/loopTime);
    measuredData.reserve(dataSize);

    EncData encData;
    encData.mpos = 0;
    bool waveform_active = true;

    // Start waveform on DOUT1 and DOUT2 (to produce EncA and EncB using test board)
    board->WriteWaveformControl(0x03, 0x03);

    // Collect the data, storing it in measuredData
    while (waveform_active || (encData.mpos == 0)) {
        port->ReadAllBoards();
        waveform_active = board->GetDigitalInput()&0x20000000;
        if (waveform_active) {
            encData.mpos = board->GetEncoderPosition(testAxis);
            encData.mvel = board->GetEncoderVelocity(testAxis);
            encData.mvelpred = board->GetEncoderVelocityPredicted(testAxis);
            encData.maccel = board->GetEncoderAcceleration(testAxis);
            encData.run = board->GetEncoderRunningCounterSeconds(testAxis);
            encData.ts = board->GetTimestampSeconds();
            if (!board->GetEncoderVelocityData(testAxis, encData.encVelData))
                std::cout << "GetEncoderVelocityData failed" << std::endl;
            measuredData.push_back(encData);
        }
        Amp1394_Sleep(loopTime);
    }
    std::cout << "Read " << measuredData.size() << " samples" << std::endl;

    // Synchronize time
    // Time as measured by FPGA (accumulated timestamp values)
    double clkTime = 0.0;

    // Reference encoder position
    int epos = motion.GetEncoderEventPosition(0);
    size_t curIndex = 1;

    // For computing mean time difference
    double sumDiff = 0.0;
    unsigned int numDiff = 0;

    size_t dataIndex;
    for (dataIndex = 0; dataIndex < measuredData.size(); dataIndex++) {
        encData = measuredData[dataIndex];
        clkTime += encData.ts;
        // Find mpos in encoder list
        if (encData.mpos != epos) {
            double rtime = 0.0;
            epos = motion.GetEncoderEventPosition(curIndex);
            if (encData.mpos == epos) {
                rtime = motion.GetEncoderEventTime(curIndex);
                curIndex++;
            }
            else {
                std::cout << "Unexpected encoder position: " << encData.mpos << ", expecting " << epos
                          << " (index = " << curIndex << ")" << std::endl;
                size_t testIndex;
                int testPos = epos;
                unsigned int lastDiff = abs(epos-encData.mpos);
                unsigned int curDiff = lastDiff;
                for (testIndex = curIndex; (testIndex < motion.GetNumEncoderEvents()) && (curDiff != 0)
                         && (curDiff <= lastDiff) ; testIndex++) {
                    testPos = motion.GetEncoderEventPosition(testIndex);
                    lastDiff = curDiff;
                    curDiff = abs(testPos-encData.mpos);
                    if (curDiff == 0) {
                        std::cout << "Found match at index " << testIndex << std::endl;
                        rtime = motion.GetEncoderEventTime(testIndex);
                        curIndex = testIndex+1;
                    }
                }
                epos = encData.mpos;
            }
            // For now, consider first few encoder transitions when computing time difference
            if ((rtime > 0.0) && (!encData.encVelData.IsRunningCounterOverflow()) && (curIndex < 10)) {
                double timeDiff = clkTime-(rtime+encData.run);
                sumDiff += timeDiff;
                numDiff++;
            }
            epos = encData.mpos;
        }
    }
    double tOffset = 0.0;
    if (numDiff > 0)
        tOffset = sumDiff/numDiff;
    std::cout << "Time offset = " << tOffset << " (" << numDiff << " samples)" << std::endl;

    // Output data to file
    std::ofstream outFile("waveform.csv", std::ios_base::trunc);
    outFile << "time, mpos, mvel, mvelpred, maccel, run, rpos, rvel, raccel, ts, velper, qtr1, qtr5, flags" << std::endl;

    clkTime = -tOffset;
    for (dataIndex = 0; dataIndex < measuredData.size(); dataIndex++) {
        encData = measuredData[dataIndex];
        clkTime += encData.ts;
        double rpos, rvel, raccel;
        if (motion.GetValuesAtTime(clkTime, rpos, rvel, raccel)) {
            outFile << clkTime << ", " << encData.mpos << ", " << encData.mvel << ", " << encData.mvelpred << ", " << encData.maccel << ", "
                    << encData.run << ", " << rpos << ", " << rvel << ", " << raccel << ", " << encData.ts << ", "
                    << encData.encVelData.GetEncoderVelocityPeriod() << ", "
                    << encData.encVelData.GetEncoderQuarter1Period() << ", "
                    << encData.encVelData.GetEncoderQuarter5Period() << ", ";
            encData.encVelData.PrintFlags(outFile);
            outFile << std::endl;
        }
        else
            std::cout << "GetValuesAtTime failed for time = " << clkTime << std::endl;
    }
}